

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> * __thiscall
embree::XMLLoader::loadVec2iArray
          (vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *__return_storage_ptr__,
          XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  runtime_error *this_01;
  size_t i;
  long lVar6;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"ofs",&local_69);
    XML::parm(&local_48,this_00,&local_68);
    bVar2 = std::operator!=(&local_48,"");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar2) {
      loadBinary<std::vector<embree::Vec2<int>,std::allocator<embree::Vec2<int>>>>
                (__return_storage_ptr__,this,xml);
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar5 = ((long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x48;
      if ((uVar5 & 1) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_68,&xml->ptr->loc);
        std::operator+(&local_48,&local_68,": wrong vector<int2> body");
        std::runtime_error::runtime_error(this_01,(string *)&local_48);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::resize
                (__return_storage_ptr__,uVar5 >> 1);
      lVar6 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)(__return_storage_ptr__->
                                super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->
                                super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1)
      {
        iVar3 = Token::Int((Token *)((long)&((xml->ptr->body).
                                             super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ty + lVar6)
                          );
        iVar4 = Token::Int((Token *)((long)&(xml->ptr->body).
                                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1].ty + lVar6)
                          );
        pVVar1 = (__return_storage_ptr__->
                 super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pVVar1[uVar5].field_0.field_0.x = iVar3;
        pVVar1[uVar5].field_0.field_0.y = iVar4;
        lVar6 = lVar6 + 0x90;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2i> XMLLoader::loadVec2iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec2i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec2i>>(xml);
    } 
    else 
    {
      std::vector<Vec2i> data;
      if (xml->body.size() % 2 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int2> body");
      data.resize(xml->body.size()/2);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec2i(xml->body[2*i+0].Int(),xml->body[2*i+1].Int());
      return data;
    }
  }